

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# salesman.cpp
# Opt level: O0

tuple<int,_int>
findMaxValue_in_map(map<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
                    *mp)

{
  bool bVar1;
  pointer ppVar2;
  map<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
  *in_RSI;
  tuple<int,_int> local_40;
  _Self local_38;
  _Self local_30;
  iterator it;
  double local_20;
  double current_max;
  map<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
  *mp_local;
  tuple<int,_int> *argMax;
  
  local_20 = 0.0;
  it._M_node._4_4_ = 0;
  it._M_node._0_4_ = 0;
  std::make_tuple<int,int>((int *)mp,(int *)((long)&it._M_node + 4));
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
       ::begin(in_RSI);
  while( true ) {
    local_38._M_node =
         (_Base_ptr)
         std::
         map<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
         ::end(in_RSI);
    bVar1 = std::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_double>_>::operator->
                       (&local_30);
    if (local_20 < ppVar2->second) {
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_double>_>::operator->
                         (&local_30);
      std::_Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_double>_>::operator->(&local_30);
      std::make_tuple<int_const&,int_const&>((int *)&local_40,(int *)ppVar2);
      std::tuple<int,_int>::operator=((tuple<int,_int> *)mp,&local_40);
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_double>_>::operator->
                         (&local_30);
      local_20 = ppVar2->second;
    }
    std::_Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_double>_>::operator++(&local_30,0);
  }
  return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)mp;
}

Assistant:

std::tuple<int,int> findMaxValue_in_map(std::map<std::pair<int,int>,double> &mp){
    double current_max = 0;
    std::tuple<int,int> argMax = std::make_tuple(0,0);
    for(auto it = mp.begin(); it!=mp.end(); it++){
        if(it->second > current_max){
            argMax = std::make_tuple(it->first.first,it->first.second);
            current_max = it->second;

        }
    }
    return argMax;
}